

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::socks5_stream::handshake2<libtorrent::aux::peer_connection::start()::__0>
          (socks5_stream *this,error_code *e,anon_class_16_1_898a5c2a *h)

{
  bool bVar1;
  byte bVar2;
  uchar uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  anon_class_16_1_898a5c2a *u;
  error_code local_c0;
  __0 local_b0 [16];
  socks5_stream *local_a0;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_socks5_stream_hpp:279:5),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_peer_connection_cpp:424:6)>
  local_98;
  mutable_buffer local_80;
  error_code local_70 [2];
  __0 local_50 [16];
  error_code local_40;
  uint local_30;
  uint local_2c;
  int method;
  int version;
  char *p;
  anon_class_16_1_898a5c2a *h_local;
  error_code *e_local;
  socks5_stream *this_local;
  
  p = (char *)h;
  h_local = (anon_class_16_1_898a5c2a *)e;
  e_local = (error_code *)this;
  bVar1 = libtorrent::aux::proxy_base::handle_error<libtorrent::aux::peer_connection::start()::__0>
                    (&this->super_proxy_base,e,h);
  if (!bVar1) {
    _method = ::std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,0);
    bVar2 = libtorrent::aux::read_uint8<char*>((char **)&method);
    local_2c = (uint)bVar2;
    bVar2 = libtorrent::aux::read_uint8<char*>((char **)&method);
    local_30 = (uint)bVar2;
    if ((int)local_2c < this->m_version) {
      boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                (&local_40,unsupported_version,(type *)0x0);
      libtorrent::aux::peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,&local_40);
    }
    else if (local_30 == 0) {
      libtorrent::aux::peer_connection::start()::$_0::__0(local_50,h);
      socks_connect<libtorrent::aux::peer_connection::start()::__0>
                (this,(anon_class_16_1_898a5c2a *)local_50);
      libtorrent::aux::peer_connection::start()::$_0::~__0(local_50);
    }
    else if (local_30 == 2) {
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        lVar5 = ::std::__cxx11::string::size();
        lVar6 = ::std::__cxx11::string::size();
        ::std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,lVar5 + lVar6 + 3);
        _method = ::std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,0);
        libtorrent::aux::write_uint8<int,char*>(1,(char **)&method);
        uVar3 = ::std::__cxx11::string::size();
        libtorrent::aux::write_uint8<unsigned_char,char*>(uVar3,(char **)&method);
        libtorrent::aux::write_string(&this->m_user,(char **)&method);
        uVar3 = ::std::__cxx11::string::size();
        libtorrent::aux::write_uint8<unsigned_char,char*>(uVar3,(char **)&method);
        libtorrent::aux::write_string(&this->m_password,(char **)&method);
        local_80 = boost::asio::buffer<char,std::allocator<char>>(&this->m_buffer);
        u = (anon_class_16_1_898a5c2a *)local_80.data_;
        local_a0 = this;
        libtorrent::aux::peer_connection::start()::$_0::__0(local_b0,h);
        libtorrent::aux::
        wrap_allocator<libtorrent::socks5_stream::handshake2<libtorrent::aux::peer_connection::start()::__0>(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,unsigned_long,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>
                  (&local_98,(aux *)local_a0,(socks5_stream *)local_b0,u);
        boost::asio::
        async_write<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::socks5_stream::handshake2<libtorrent::aux::peer_connection::start()::__0>(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,unsigned_long,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>>
                  ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                    *)this,&local_80,&local_98,(type *)0x0);
        libtorrent::aux::
        wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/socks5_stream.hpp:279:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:424:6)>
        ::~wrap_allocator_t(&local_98);
        libtorrent::aux::peer_connection::start()::$_0::~__0(local_b0);
      }
      else {
        boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                  (local_70,username_required,(type *)0x0);
        libtorrent::aux::peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,local_70);
      }
    }
    else {
      boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                (&local_c0,unsupported_authentication_method,(type *)0x0);
      libtorrent::aux::peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,&local_c0);
    }
  }
  return;
}

Assistant:

void handshake2(error_code const& e, Handler h)
	{
		COMPLETE_ASYNC("socks5_stream::handshake2");
		if (handle_error(e, std::move(h))) return;

		using namespace libtorrent::aux;

		char* p = &m_buffer[0];
		int version = read_uint8(p);
		int method = read_uint8(p);

		if (version < m_version)
		{
			std::move(h)(error_code(socks_error::unsupported_version));
			return;
		}

		if (method == 0)
		{
			socks_connect(std::move(h));
		}
		else if (method == 2)
		{
			if (m_user.empty())
			{
				std::move(h)(error_code(socks_error::username_required));
				return;
			}

			// start sub-negotiation
			m_buffer.resize(m_user.size() + m_password.size() + 3);
			p = &m_buffer[0];
			write_uint8(1, p);
			TORRENT_ASSERT(m_user.size() < 0x100);
			write_uint8(uint8_t(m_user.size()), p);
			write_string(m_user, p);
			TORRENT_ASSERT(m_password.size() < 0x100);
			write_uint8(uint8_t(m_password.size()), p);
			write_string(m_password, p);

			ADD_OUTSTANDING_ASYNC("socks5_stream::handshake3");
			async_write(m_sock, boost::asio::buffer(m_buffer), aux::wrap_allocator(
				[this](error_code const& ec, std::size_t const, Handler hn) {
					handshake3(ec, std::move(hn));
				}, std::move(h)));
		}
		else
		{
			std::move(h)(error_code(socks_error::unsupported_authentication_method));
			return;
		}
	}